

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O0

void __thiscall
iir_filter<6>::iir_filter
          (iir_filter<6> *this,double gain,array<double,_7UL> *b,array<double,_7UL> *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  array<double,_7UL> *this_00;
  const_reference pvVar6;
  size_type sVar7;
  size_type local_48;
  size_t ii;
  allocator<double> local_29;
  array<double,_7UL> *local_28;
  array<double,_7UL> *a_local;
  array<double,_7UL> *b_local;
  double gain_local;
  iir_filter<6> *this_local;
  
  this->gain_m = gain;
  (this->b_m)._M_elems[6] = b->_M_elems[6];
  dVar1 = b->_M_elems[0];
  dVar2 = b->_M_elems[1];
  dVar3 = b->_M_elems[2];
  dVar4 = b->_M_elems[3];
  dVar5 = b->_M_elems[5];
  (this->b_m)._M_elems[4] = b->_M_elems[4];
  (this->b_m)._M_elems[5] = dVar5;
  (this->b_m)._M_elems[2] = dVar3;
  (this->b_m)._M_elems[3] = dVar4;
  (this->b_m)._M_elems[0] = dVar1;
  (this->b_m)._M_elems[1] = dVar2;
  (this->a_m)._M_elems[6] = a->_M_elems[6];
  dVar1 = a->_M_elems[0];
  dVar2 = a->_M_elems[1];
  dVar3 = a->_M_elems[2];
  dVar4 = a->_M_elems[3];
  dVar5 = a->_M_elems[5];
  (this->a_m)._M_elems[4] = a->_M_elems[4];
  (this->a_m)._M_elems[5] = dVar5;
  (this->a_m)._M_elems[2] = dVar3;
  (this->a_m)._M_elems[3] = dVar4;
  (this->a_m)._M_elems[0] = dVar1;
  (this->a_m)._M_elems[1] = dVar2;
  local_28 = a;
  a_local = b;
  b_local = (array<double,_7UL> *)gain;
  gain_local = (double)this;
  std::allocator<double>::allocator(&local_29);
  boost::circular_buffer<double,_std::allocator<double>_>::circular_buffer<int>
            (&this->xv_m,7,0,&local_29);
  std::allocator<double>::~allocator(&local_29);
  std::allocator<double>::allocator((allocator<double> *)((long)&ii + 3));
  boost::circular_buffer<double,_std::allocator<double>_>::circular_buffer<int>
            (&this->yv_m,7,0,(allocator<double> *)((long)&ii + 3));
  std::allocator<double>::~allocator((allocator<double> *)((long)&ii + 3));
  pvVar6 = std::array<double,_7UL>::operator[](local_28,0);
  if ((*pvVar6 == 1.0) && (!NAN(*pvVar6))) {
    local_48 = 0;
    while( true ) {
      if (local_48 == 3) {
        return;
      }
      pvVar6 = std::array<double,_7UL>::operator[](a_local,local_48);
      this_00 = a_local;
      dVar1 = *pvVar6;
      sVar7 = std::array<double,_7UL>::size(a_local);
      pvVar6 = std::array<double,_7UL>::operator[](this_00,(sVar7 - local_48) - 1);
      if ((dVar1 != *pvVar6) || (NAN(dVar1) || NAN(*pvVar6))) break;
      local_48 = local_48 + 1;
    }
    __assert_fail("b[ii] == b[b.size() - ii - 1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/../dsp.h",
                  0xf9,
                  "iir_filter<6>::iir_filter(double, const std::array<double, ORDER + 1> &, const std::array<double, ORDER + 1> &) [ORDER = 6]"
                 );
  }
  __assert_fail("a[0] == 1.0",
                "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/../dsp.h",
                0xf7,
                "iir_filter<6>::iir_filter(double, const std::array<double, ORDER + 1> &, const std::array<double, ORDER + 1> &) [ORDER = 6]"
               );
}

Assistant:

explicit iir_filter(double gain, const std::array<double, ORDER + 1>& b,
                        const std::array<double, ORDER + 1>& a)
      : gain_m(gain)
      , b_m(b)
      , a_m(a)
      , xv_m(ORDER + 1, 0)
      , yv_m(ORDER + 1, 0)
    {
        assert(a[0] == 1.0);
        for (size_t ii(0); ii != (ORDER + 1) / 2; ++ii)
            assert(b[ii] == b[b.size() - ii - 1]);
    }